

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
MinVR::VRDataIndex::getValueWithDefault<std::__cxx11::string>
          (VRDataIndex *this,string *key,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *defaultVal,
          string *nameSpace,bool inherit)

{
  bool bVar1;
  pointer ppVar2;
  VRDatum *pVVar3;
  string *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_R8;
  byte in_R9B;
  iterator p;
  bool in_stack_00000107;
  string *in_stack_00000108;
  string *in_stack_00000110;
  VRDataIndex *in_stack_00000118;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
  *in_stack_ffffffffffffff38;
  _Self local_78;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
  local_70 [3];
  string local_58 [32];
  iterator local_38;
  byte local_29;
  string *local_20;
  
  local_29 = in_R9B & 1;
  local_20 = in_RCX;
  std::__cxx11::string::string(local_58,in_R8);
  local_38._M_node =
       (_Base_ptr)_getEntry(in_stack_00000118,in_stack_00000110,in_stack_00000108,in_stack_00000107)
  ;
  std::__cxx11::string::~string(local_58);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
  ::_Rb_tree_const_iterator(local_70,&local_38);
  local_78._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
       ::end(in_stack_ffffffffffffff38);
  bVar1 = std::operator==(local_70,&local_78);
  if (bVar1) {
    std::__cxx11::string::string((string *)in_RDI,local_20);
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
                           *)0x173729);
    pVVar3 = VRDatumPtr::operator->(&ppVar2->second);
    (*pVVar3->_vptr_VRDatum[3])();
    VRDatumConverter::operator_cast_to_string
              ((VRDatumConverter<MinVR::VRDatum> *)in_stack_ffffffffffffff38);
  }
  return in_RDI;
}

Assistant:

T getValueWithDefault(const std::string &key,
                        const T &defaultVal,
                        const std::string nameSpace = "",
                        const bool inherit = true) const {
    VRDataMap::iterator p =
      const_cast<VRDataIndex*>(this)->_getEntry(key, nameSpace, inherit);

    if (p == _theIndex.end()) {
      return defaultVal;
    } else {
      return p->second->getValue();
    }
  }